

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdGetSighashTypeFromSchnorrSignature
              (void *handle,char *signature,int *sighash_type,bool *anyone_can_pay)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  long in_RCX;
  uint32_t *in_RDX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  SigHashType sighash_type_obj;
  SchnorrSignature sig;
  int result;
  string *in_stack_fffffffffffffee0;
  CfdError in_stack_fffffffffffffeec;
  CfdException *in_stack_fffffffffffffef0;
  undefined1 local_d8 [16];
  string local_c8;
  SchnorrSignature local_a8;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined4 local_2c;
  long local_28;
  uint32_t *local_20;
  char *local_18;
  int local_4;
  
  local_2c = 0xffffffff;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,local_18,(allocator *)(local_d8 + 0xf));
    cfd::core::SchnorrSignature::SchnorrSignature(&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0xf));
    cfd::core::SchnorrSignature::GetSigHashType((SchnorrSignature *)local_d8);
    if (local_20 != (uint32_t *)0x0) {
      uVar2 = cfd::core::SigHashType::GetSigHashFlag((SigHashType *)local_d8);
      *local_20 = uVar2;
    }
    if (local_28 != 0) {
      bVar1 = cfd::core::SigHashType::IsAnyoneCanPay((SigHashType *)local_d8);
      *(bool *)local_28 = bVar1;
    }
    local_4 = 0;
    cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)0x5d22a2);
    return local_4;
  }
  local_58.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_58.filename = local_58.filename + 1;
  local_58.line = 0x2e9;
  local_58.funcname = "CfdGetSighashTypeFromSchnorrSignature";
  cfd::core::logger::warn<>(&local_58,"signature is null or empty.");
  local_7a = 1;
  uVar3 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"Failed to parameter. signature is null or empty.",&local_79);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0);
  local_7a = 0;
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSighashTypeFromSchnorrSignature(
    void* handle, const char* signature, int* sighash_type,
    bool* anyone_can_pay) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    SchnorrSignature sig(signature);
    auto sighash_type_obj = sig.GetSigHashType();
    if (sighash_type != nullptr) {
      *sighash_type = static_cast<int>(sighash_type_obj.GetSigHashFlag());
    }
    if (anyone_can_pay != nullptr) {
      *anyone_can_pay = sighash_type_obj.IsAnyoneCanPay();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}